

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_diag_mask_f32(ggml_compute_params *params,ggml_tensor *dst,float value)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ggml_tensor *pgVar5;
  void *__dest;
  void *__src;
  char cVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  size_t __n;
  int iVar10;
  char *pcVar11;
  long lVar12;
  undefined8 uVar13;
  ulong uVar14;
  long lVar15;
  
  iVar1 = dst->op_params[0];
  lVar12 = (long)iVar1;
  if (lVar12 < 0) {
    pcVar11 = "n_past >= 0";
    uVar13 = 0x11d6;
    goto LAB_0013dac3;
  }
  pgVar5 = dst->src[0];
  iVar2 = params->ith;
  iVar3 = params->nth;
  if (pgVar5->data != dst->data) {
    if (iVar2 == 0) {
      lVar8 = ggml_nelements(dst);
      lVar9 = ggml_nelements(pgVar5);
      if (lVar8 != lVar9) {
        pcVar11 = "ggml_nelements(dst) == ggml_nelements(src0)";
        uVar13 = 0x11dc;
        goto LAB_0013dac3;
      }
      cVar6 = ggml_is_contiguous(dst);
      if (cVar6 != '\0') {
        cVar6 = ggml_is_contiguous(pgVar5);
        if (cVar6 != '\0') {
          __dest = dst->data;
          __src = pgVar5->data;
          __n = ggml_nbytes(dst);
          memcpy(__dest,__src,__n);
          goto LAB_0013d991;
        }
      }
      pcVar11 = "ggml_is_contiguous(dst) && ggml_is_contiguous(src0)";
      uVar13 = 0x11dd;
      goto LAB_0013dac3;
    }
LAB_0013d991:
    ggml_barrier(params->threadpool);
  }
  iVar7 = ggml_nrows();
  iVar10 = (int)pgVar5->ne[1];
  if (dst->nb[0] == 4) {
    if (pgVar5->nb[0] == 4) {
      if (0 < (int)((long)iVar7 / (long)iVar10)) {
        iVar4 = (int)pgVar5->ne[0];
        uVar14 = 0;
        do {
          lVar8 = (long)iVar2;
          if (iVar2 < iVar10) {
            do {
              if (iVar1 < iVar4) {
                lVar9 = lVar12;
                lVar15 = lVar12;
                do {
                  if (lVar8 + lVar12 < lVar9) {
                    *(float *)((long)dst->data +
                              lVar15 * 4 + dst->nb[1] * lVar8 + dst->nb[2] * uVar14) = value;
                  }
                  lVar15 = lVar15 + 1;
                  lVar9 = lVar9 + 1;
                } while ((int)lVar9 < iVar4);
              }
              lVar8 = lVar8 + iVar3;
            } while (lVar8 < iVar10);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != ((long)iVar7 / (long)iVar10 & 0xffffffffU));
      }
      return;
    }
    pcVar11 = "src0->nb[0] == sizeof(float)";
    uVar13 = 0x11ee;
  }
  else {
    pcVar11 = "dst->nb[0] == sizeof(float)";
    uVar13 = 0x11ed;
  }
LAB_0013dac3:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
             ,uVar13,"GGML_ASSERT(%s) failed",pcVar11);
}

Assistant:

static void ggml_compute_forward_diag_mask_f32(
        const ggml_compute_params * params,
        ggml_tensor * dst,
        const float value) {

    const ggml_tensor * src0 = dst->src[0];

    const int ith = params->ith;
    const int nth = params->nth;

    const int  n_past  = ((int32_t *) dst->op_params)[0];
    const bool inplace = src0->data == dst->data;

    GGML_ASSERT(n_past >= 0);

    if (!inplace) {
        if (ith == 0) {
            // memcpy needs to be synchronized across threads to avoid race conditions.
            // => do it in INIT phase
            GGML_ASSERT(ggml_nelements(dst) == ggml_nelements(src0));
            GGML_ASSERT(ggml_is_contiguous(dst) && ggml_is_contiguous(src0));
            memcpy(
                ((char *)  dst->data),
                ((char *) src0->data),
                ggml_nbytes(dst));
        }
        ggml_barrier(params->threadpool);
    }

    // TODO: handle transposed/permuted matrices

    const int n  = ggml_nrows(src0);
    const int nc = src0->ne[0];
    const int nr = src0->ne[1];
    const int nz = n/nr;

    GGML_ASSERT( dst->nb[0] == sizeof(float));
    GGML_ASSERT(src0->nb[0] == sizeof(float));

    for (int k = 0; k < nz; k++) {
        for (int j = ith; j < nr; j += nth) {
            for (int i = n_past; i < nc; i++) {
                if (i > n_past + j) {
                    *(float *)((char *) dst->data + k*dst->nb[2] + j*dst->nb[1] + i*dst->nb[0]) = value;
                }
            }
        }
    }
}